

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThreadData::clearEvents(QThreadData *this)

{
  int *piVar1;
  QPostEvent *pQVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  pQVar2 = (this->postEventList).super_QList<QPostEvent>.d.ptr;
  lVar3 = (this->postEventList).super_QList<QPostEvent>.d.size;
  for (lVar5 = 0; lVar3 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
    if (*(long *)((long)&pQVar2->event + lVar5) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(*(long *)((long)&pQVar2->receiver + lVar5) + 8) + 0x34);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      plVar4 = *(long **)((long)&pQVar2->event + lVar5);
      *(undefined1 *)((long)plVar4 + 10) = 0;
      (**(code **)(*plVar4 + 8))();
    }
  }
  QList<QPostEvent>::clear(&(this->postEventList).super_QList<QPostEvent>);
  return;
}

Assistant:

void QThreadData::clearEvents()
{
    for (const auto &pe : std::as_const(postEventList)) {
        if (pe.event) {
            pe.receiver->d_func()->postedEvents.fetchAndSubRelaxed(1);
            pe.event->m_posted = false;
            delete pe.event;
        }
    }
    postEventList.clear();
}